

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O3

void pythonEndElement(void *user_data,xmlChar *name)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  char *pcVar4;
  
  iVar1 = PyObject_HasAttrString(user_data,"endElement");
  if (iVar1 == 0) {
    iVar1 = PyObject_HasAttrString(user_data,"end");
    if (iVar1 == 0) {
      return;
    }
    pcVar4 = "end";
  }
  else {
    pcVar4 = "endElement";
  }
  plVar2 = (long *)_PyObject_CallMethod_SizeT(user_data,pcVar4,"s",name);
  lVar3 = PyErr_Occurred();
  if (lVar3 != 0) {
    PyErr_Print();
  }
  if ((plVar2 != (long *)0x0) && (*plVar2 = *plVar2 + -1, *plVar2 == 0)) {
    _Py_Dealloc(plVar2);
    return;
  }
  return;
}

Assistant:

static void
pythonEndElement(void *user_data, const xmlChar * name)
{
    PyObject *handler;
    PyObject *result;

#ifdef DEBUG_SAX
    printf("pythonEndElement(%s) called\n", name);
#endif
    handler = (PyObject *) user_data;
    if (PyObject_HasAttrString(handler, (char *) "endElement")) {
        result = PyObject_CallMethod(handler, (char *) "endElement",
                                     (char *) "s", name);
        if (PyErr_Occurred())
            PyErr_Print();
        Py_XDECREF(result);
    } else if (PyObject_HasAttrString(handler, (char *) "end")) {
        result = PyObject_CallMethod(handler, (char *) "end",
                                     (char *) "s", name);
        if (PyErr_Occurred())
            PyErr_Print();
        Py_XDECREF(result);
    }
}